

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excl.c
# Opt level: O1

int nn_excl_add(nn_excl *self,nn_pipe *pipe)

{
  if (self->pipe != (nn_pipe *)0x0) {
    return -0x6a;
  }
  self->pipe = pipe;
  return 0;
}

Assistant:

int nn_excl_add (struct nn_excl *self, struct nn_pipe *pipe)
{
    /*  If there's a connection being used, reject any new connection. */
    if (self->pipe)
        return -EISCONN;

    /*  Remember that this pipe is the active one. */
    self->pipe = pipe;

    return 0;
}